

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubDivs0(Abc_ManRes_t *p)

{
  void *pvVar1;
  Abc_Obj_t *pObj_00;
  Dec_Graph_t *pDVar2;
  int local_38;
  int local_34;
  int w;
  int i;
  uint *puDataR;
  uint *puData;
  Abc_Obj_t *pObj;
  Abc_ManRes_t *p_local;
  
  pvVar1 = (p->pRoot->field_5).pData;
  local_34 = 0;
  while( true ) {
    if (p->nDivs <= local_34) {
      return (Dec_Graph_t *)0x0;
    }
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,local_34);
    local_38 = 0;
    while ((local_38 < p->nWords &&
           (((*(uint *)((long)(pObj_00->field_5).pData + (long)local_38 * 4) ^
             *(uint *)((long)pvVar1 + (long)local_38 * 4)) & p->pCareSet[local_38]) == 0))) {
      local_38 = local_38 + 1;
    }
    if (local_38 == p->nWords) break;
    local_34 = local_34 + 1;
  }
  pDVar2 = Abc_ManResubQuit0(p->pRoot,pObj_00);
  return pDVar2;
}

Assistant:

Dec_Graph_t * Abc_ManResubDivs0( Abc_ManRes_t * p )
{
    Abc_Obj_t * pObj;
    unsigned * puData, * puDataR;
    int i, w;
    puDataR = (unsigned *)p->pRoot->pData;
    Vec_PtrForEachEntryStop( Abc_Obj_t *, p->vDivs, pObj, i, p->nDivs )
    {
        puData = (unsigned *)pObj->pData;
        for ( w = 0; w < p->nWords; w++ )
//            if ( puData[w] != puDataR[w] )
            if ( (puData[w] ^ puDataR[w]) & p->pCareSet[w] ) // care set
                break;
        if ( w == p->nWords )
            return Abc_ManResubQuit0( p->pRoot, pObj );
    }
    return NULL;
}